

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool ProduceSignature(SigningProvider *provider,BaseSignatureCreator *creator,CScript *fromPubKey,
                     SignatureData *sigdata)

{
  byte bVar1;
  long lVar2;
  pointer pbVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  Availability AVar7;
  opcodetype opcode;
  int iVar8;
  CScript *pCVar9;
  undefined4 extraout_var;
  uint uVar10;
  size_type sVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  valtype *v;
  pointer pvVar12;
  long in_FS_OFFSET;
  bool bVar13;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  NodeRef<typename_WshSatisfier::Key> ms;
  TxoutType subType_1;
  TxoutType whichType;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  result;
  CScript witnessscript;
  TxoutType subType;
  undefined8 local_70;
  uint local_5c;
  CScript subscript;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = true;
  if (sigdata->complete != false) goto LAB_00183ec5;
  result.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = SignStep(provider,creator,fromPubKey,&result,&whichType,BASE,sigdata);
  subscript.super_CScriptBase._union._16_8_ = 0;
  subscript.super_CScriptBase._24_8_ = 0;
  subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  subscript.super_CScriptBase._union._8_8_ = 0;
  bVar13 = whichType != SCRIPTHASH;
  bVar6 = bVar5;
  if (!bVar13 && bVar5) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              (&witnessscript.super_CScriptBase,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )((result.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )((result.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&subscript.super_CScriptBase,&witnessscript.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessscript.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->redeem_script).super_CScriptBase,&subscript.super_CScriptBase);
    bVar6 = SignStep(provider,creator,&subscript,&result,&whichType,BASE,sigdata);
    bVar6 = bVar6 && whichType != SCRIPTHASH;
  }
  if ((whichType == WITNESS_V0_KEYHASH & bVar6) == 1) {
    witnessscript.super_CScriptBase._union._16_8_ = 0;
    witnessscript.super_CScriptBase._24_8_ = 0;
    witnessscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    witnessscript.super_CScriptBase._union._8_8_ = 0;
    pCVar9 = CScript::operator<<(&witnessscript,OP_DUP);
    pCVar9 = CScript::operator<<(pCVar9,OP_HASH160);
    ToByteVector<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&subType,
               result.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    b._M_extent._M_extent_value = local_70 - _subType;
    b._M_ptr = (pointer)_subType;
    pCVar9 = CScript::operator<<(pCVar9,b);
    pCVar9 = CScript::operator<<(pCVar9,OP_EQUALVERIFY);
    CScript::operator<<(pCVar9,OP_CHECKSIG);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&subType);
    bVar6 = SignStep(provider,creator,&witnessscript,&result,&subType,WITNESS_V0,sigdata);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=(&(sigdata->scriptWitness).stack,&result);
    sigdata->witness = true;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::clear(&result);
    this = &witnessscript.super_CScriptBase;
LAB_00183d92:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(this);
  }
  else {
    if ((whichType == WITNESS_V0_SCRIPTHASH & bVar6) == 1) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&subType,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((result.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((result.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(sigdata->witness_script).super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&subType);
      subType_1 = NONSTANDARD;
      bVar6 = SignStep(provider,creator,(CScript *)&subType,&result,&subType_1,WITNESS_V0,sigdata);
      if (bVar6) {
        bVar6 = true;
        if ((subType_1 < WITNESS_V1_TAPROOT) && ((400U >> (subType_1 & 0x1f) & 1) != 0))
        goto LAB_00183c7a;
      }
      else {
LAB_00183c7a:
        if (result.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            result.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          witnessscript.super_CScriptBase._union.indirect_contents.indirect = (char *)provider;
          witnessscript.super_CScriptBase._union._8_8_ = sigdata;
          witnessscript.super_CScriptBase._union._16_8_ = creator;
          witnessscript.super_CScriptBase._24_8_ = (CScript *)&subType;
          miniscript::FromScript<WshSatisfier>
                    ((miniscript *)&ms,(CScript *)&subType,(WshSatisfier *)&witnessscript);
          if (ms.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            bVar6 = false;
          }
          else {
            AVar7 = miniscript::Node<CPubKey>::Satisfy<WshSatisfier>
                              (ms.
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,(WshSatisfier *)&witnessscript,&result,true);
            bVar6 = AVar7 == YES;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&ms.
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else {
          bVar6 = false;
        }
      }
      witnessscript.super_CScriptBase._union.indirect_contents.indirect =
           (char *)(CScript *)&subType;
      if (0x1c < local_5c) {
        witnessscript.super_CScriptBase._union.indirect_contents.indirect = (char *)_subType;
      }
      uVar10 = local_5c - 0x1d;
      if (0x1c >= local_5c) {
        uVar10 = local_5c;
      }
      ms.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)&(((CScript *)witnessscript.super_CScriptBase._union.indirect_contents.indirect)->
                   super_CScriptBase)._union + (long)(int)uVar10);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&result,(iterator *)&witnessscript,(iterator *)&ms);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&(sigdata->scriptWitness).stack,&result);
      sigdata->witness = true;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::clear(&result);
      this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&subType;
      goto LAB_00183d92;
    }
    if (whichType == WITNESS_V1_TAPROOT && (bVar13 || !bVar5)) {
      sigdata->witness = true;
      if (bVar6 != false) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::_M_move_assign(&(sigdata->scriptWitness).stack,&result);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::clear(&result);
    }
    else if ((whichType == WITNESS_UNKNOWN & bVar6) == 1) {
      sigdata->witness = true;
      bVar6 = true;
    }
  }
  if (sigdata->witness == false) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::clear(&(sigdata->scriptWitness).stack);
  }
  if (!bVar13 && bVar5) {
    witnessscript.super_CScriptBase._union.indirect_contents.indirect = (char *)&subscript;
    if (0x1c < subscript.super_CScriptBase._size) {
      witnessscript.super_CScriptBase._union.indirect_contents.indirect =
           subscript.super_CScriptBase._union.indirect_contents.indirect;
    }
    sVar11 = subscript.super_CScriptBase._size - 0x1d;
    if (0x1c >= subscript.super_CScriptBase._size) {
      sVar11 = subscript.super_CScriptBase._size;
    }
    _subType = (long)&(((CScript *)witnessscript.super_CScriptBase._union.indirect_contents.indirect
                       )->super_CScriptBase)._union + (long)(int)sVar11;
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&result,(iterator *)&witnessscript,(iterator *)&subType);
  }
  pvVar4 = result.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  witnessscript.super_CScriptBase._union._16_8_ = 0;
  witnessscript.super_CScriptBase._24_8_ = 0;
  witnessscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  witnessscript.super_CScriptBase._union._8_8_ = 0;
  for (pvVar12 = result.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar12 != pvVar4; pvVar12 = pvVar12 + 1
      ) {
    pbVar3 = (pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    b_00._M_extent._M_extent_value =
         (long)(pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar3;
    if (b_00._M_extent._M_extent_value == 0) {
      opcode = OP_0;
LAB_00183e38:
      CScript::operator<<(&witnessscript,opcode);
    }
    else {
      if ((b_00._M_extent._M_extent_value == 1) && (bVar1 = *pbVar3, bVar1 != 0)) {
        if (bVar1 < 0x11) {
          opcode = CScript::EncodeOP_N((uint)bVar1);
        }
        else {
          opcode = OP_1NEGATE;
          if (bVar1 != 0x81) goto LAB_00183e4f;
        }
        goto LAB_00183e38;
      }
LAB_00183e4f:
      b_00._M_ptr = pbVar3;
      CScript::operator<<(&witnessscript,b_00);
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(sigdata->scriptSig).super_CScriptBase,&witnessscript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessscript.super_CScriptBase);
  if (bVar6 == false) {
    bVar6 = false;
  }
  else {
    iVar8 = (*creator->_vptr_BaseSignatureCreator[2])();
    bVar6 = VerifyScript(&sigdata->scriptSig,fromPubKey,&sigdata->scriptWitness,0x1fffdf,
                         (BaseSignatureChecker *)CONCAT44(extraout_var,iVar8),(ScriptError *)0x0);
  }
  sigdata->complete = bVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&result);
LAB_00183ec5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool ProduceSignature(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& fromPubKey, SignatureData& sigdata)
{
    if (sigdata.complete) return true;

    std::vector<valtype> result;
    TxoutType whichType;
    bool solved = SignStep(provider, creator, fromPubKey, result, whichType, SigVersion::BASE, sigdata);
    bool P2SH = false;
    CScript subscript;

    if (solved && whichType == TxoutType::SCRIPTHASH)
    {
        // Solver returns the subscript that needs to be evaluated;
        // the final scriptSig is the signatures from that
        // and then the serialized subscript:
        subscript = CScript(result[0].begin(), result[0].end());
        sigdata.redeem_script = subscript;
        solved = solved && SignStep(provider, creator, subscript, result, whichType, SigVersion::BASE, sigdata) && whichType != TxoutType::SCRIPTHASH;
        P2SH = true;
    }

    if (solved && whichType == TxoutType::WITNESS_V0_KEYHASH)
    {
        CScript witnessscript;
        witnessscript << OP_DUP << OP_HASH160 << ToByteVector(result[0]) << OP_EQUALVERIFY << OP_CHECKSIG;
        TxoutType subType;
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata);
        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    }
    else if (solved && whichType == TxoutType::WITNESS_V0_SCRIPTHASH)
    {
        CScript witnessscript(result[0].begin(), result[0].end());
        sigdata.witness_script = witnessscript;

        TxoutType subType{TxoutType::NONSTANDARD};
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata) && subType != TxoutType::SCRIPTHASH && subType != TxoutType::WITNESS_V0_SCRIPTHASH && subType != TxoutType::WITNESS_V0_KEYHASH;

        // If we couldn't find a solution with the legacy satisfier, try satisfying the script using Miniscript.
        // Note we need to check if the result stack is empty before, because it might be used even if the Script
        // isn't fully solved. For instance the CHECKMULTISIG satisfaction in SignStep() pushes partial signatures
        // and the extractor relies on this behaviour to combine witnesses.
        if (!solved && result.empty()) {
            WshSatisfier ms_satisfier{provider, sigdata, creator, witnessscript};
            const auto ms = miniscript::FromScript(witnessscript, ms_satisfier);
            solved = ms && ms->Satisfy(ms_satisfier, result) == miniscript::Availability::YES;
        }
        result.emplace_back(witnessscript.begin(), witnessscript.end());

        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    } else if (whichType == TxoutType::WITNESS_V1_TAPROOT && !P2SH) {
        sigdata.witness = true;
        if (solved) {
            sigdata.scriptWitness.stack = std::move(result);
        }
        result.clear();
    } else if (solved && whichType == TxoutType::WITNESS_UNKNOWN) {
        sigdata.witness = true;
    }

    if (!sigdata.witness) sigdata.scriptWitness.stack.clear();
    if (P2SH) {
        result.emplace_back(subscript.begin(), subscript.end());
    }
    sigdata.scriptSig = PushAll(result);

    // Test solution
    sigdata.complete = solved && VerifyScript(sigdata.scriptSig, fromPubKey, &sigdata.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, creator.Checker());
    return sigdata.complete;
}